

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filter.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *pCVar1;
  ostream *poVar2;
  undefined1 local_370 [32];
  Scalar local_350;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_348;
  int local_328 [2];
  undefined1 local_320 [8];
  VectorXd measurement;
  undefined1 local_300 [40];
  MatrixXd local_2d8;
  MatrixXd local_2c0;
  MatrixXd local_2a8;
  VectorXd local_290;
  MatrixXd local_280;
  undefined1 local_268 [8];
  KFilter filter;
  Scalar local_1d0;
  Scalar local_1c8;
  Scalar local_1c0;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_1b8;
  undefined1 local_198 [8];
  Matrix2d Q;
  Scalar local_170;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_168;
  int local_148 [2];
  undefined1 local_140 [8];
  MatrixXd R;
  double local_120;
  Matrix<double,1,2,1,1,2> local_118 [8];
  RowVector2d H;
  Scalar local_100;
  Scalar local_f8;
  Scalar local_f0;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_e8;
  DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_c8 [8];
  Matrix2d P;
  double local_a0;
  Matrix<double,2,1,0,2,1> local_98 [8];
  Vector2d x;
  Scalar local_80 [3];
  Scalar local_68;
  Scalar local_60;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_58;
  DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_38 [8];
  Matrix2d F;
  char **argv_local;
  int argc_local;
  
  F.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3] =
       (double)argv;
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix((Matrix<double,_2,_2,_0,_2,_2> *)local_38);
  local_60 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator<<(&local_58,local_38,&local_60);
  local_68 = 0.1;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (&local_58,&local_68);
  local_80[0] = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar1,local_80);
  x.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
            (pCVar1,x.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                    array + 1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::~CommaInitializer(&local_58);
  local_a0 = 10.0;
  P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3] = 4.5;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
            (local_98,&local_a0,
             P.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array +
             3);
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix((Matrix<double,_2,_2,_0,_2,_2> *)local_c8);
  local_f0 = 500.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator<<(&local_e8,local_c8,&local_f0);
  local_f8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (&local_e8,&local_f8);
  local_100 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar1,&local_100);
  H.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] = 49.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
            (pCVar1,H.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
                    array + 1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::~CommaInitializer(&local_e8);
  local_120 = 1.0;
  R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  Eigen::Matrix<double,1,2,1,1,2>::Matrix<double,double>
            (local_118,&local_120,
             (double *)
             &R.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  local_148[1] = 1;
  local_148[0] = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_140,local_148 + 1,local_148);
  local_170 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_168,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_140,&local_170
            );
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_168);
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix((Matrix<double,_2,_2,_0,_2,_2> *)local_198);
  local_1c0 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator<<
            (&local_1b8,(DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_198,&local_1c0);
  local_1c8 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (&local_1b8,&local_1c8);
  local_1d0 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar1,&local_1d0);
  filter.measurement_dimension_ = -0x66666666;
  filter.state_dimension_ = 0x3fb99999;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
            (pCVar1,(Scalar *)&filter.measurement_dimension_);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::~CommaInitializer(&local_1b8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,2,0,2,2>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_280,
             (EigenBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_38);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,2,1,0,2,1>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_290,
             (EigenBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_98);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,2,0,2,2>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_2a8,
             (EigenBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_c8);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,2,2,0,2,2>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_2c0,
             (EigenBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)local_198);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,1,2,1,1,2>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_2d8,
             (EigenBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)local_118);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)(local_300 + 0x10),
             (Matrix<double,__1,__1,_0,__1,__1> *)local_140);
  KFilter::KFilter((KFilter *)local_268,&local_280,&local_290,&local_2a8,&local_2c0,&local_2d8,
                   (MatrixXd *)(local_300 + 0x10));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)(local_300 + 0x10));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2d8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2c0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_2a8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_290);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_280);
  KFilter::x((KFilter *)local_300);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_300);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_300);
  KFilter::predict((KFilter *)local_268);
  KFilter::x((KFilter *)
             &measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                             &measurement.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &measurement.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  local_328[1] = 1;
  local_328[0] = 1;
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<int,int>
            ((Matrix<double,_1,1,0,_1,1> *)local_320,local_328 + 1,local_328);
  local_350 = 10.3;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_348,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_320,&local_350);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_348);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)(local_370 + 0x10),
             (Matrix<double,__1,_1,_0,__1,_1> *)local_320);
  KFilter::update((KFilter *)local_268,(VectorXd *)(local_370 + 0x10));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)(local_370 + 0x10));
  KFilter::x((KFilter *)local_370);
  poVar2 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_370);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_370);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_320);
  KFilter::~KFilter((KFilter *)local_268);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_140);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
    Matrix2d F;
    F << 1, 0.1,
         0, 1;
    Vector2d x(10.0, 4.5);
    Matrix2d P;
    P << 500, 0,
         0,   49;
    RowVector2d H(1.0, 0.0);
    MatrixXd R(1, 1);
    R << 1;
    Matrix2d Q;
    Q << 0.0, 0.0,
         0.0, 0.1;

    KFilter filter(F, x, P, Q, H, R);
    std::cout << filter.x() << std::endl;
    filter.predict();
    std::cout << filter.x() << std::endl;
    Eigen::VectorXd measurement(1, 1);
    measurement << 10.3;
    filter.update(measurement);
    std::cout << filter.x() << std::endl;
    return 0;
}